

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flv.c
# Opt level: O3

int flvtag_initavc(flvtag_t *tag,uint32_t dts,int32_t cts,flvtag_frametype_t type)

{
  uint8_t *puVar1;
  int iVar2;
  
  puVar1 = (uint8_t *)malloc(0x814);
  tag->data = puVar1;
  tag->aloc = 0x814;
  puVar1[4] = (uint8_t)(dts >> 0x10);
  puVar1[5] = (uint8_t)(dts >> 8);
  puVar1[6] = (uint8_t)dts;
  puVar1[7] = (uint8_t)(dts >> 0x18);
  puVar1[8] = '\0';
  puVar1[9] = '\0';
  puVar1[10] = '\0';
  iVar2 = type << 4;
  puVar1[0xb] = ((char)(uint)((ulong)((long)iVar2 * 0x88888889) >> 0x27) - (char)(iVar2 >> 0x1f)) *
                '\x10' + (char)iVar2 | 7;
  puVar1[0xc] = '\x01';
  puVar1[0xd] = (uint8_t)((uint)cts >> 0x10);
  puVar1[0xe] = (uint8_t)((uint)cts >> 8);
  puVar1[0xf] = (uint8_t)cts;
  puVar1[0] = '\t';
  puVar1[1] = '\0';
  puVar1[2] = '\0';
  puVar1[3] = '\x05';
  puVar1[0x10] = '\0';
  puVar1[0x11] = '\0';
  puVar1[0x12] = '\0';
  puVar1[0x13] = '\x10';
  return 1;
}

Assistant:

int flvtag_initavc(flvtag_t* tag, uint32_t dts, int32_t cts, flvtag_frametype_t type)
{
    flvtag_init(tag);
    flvtag_reserve(tag, 5 + FLVTAG_PREALOC);
    tag->data[0] = flvtag_type_video;
    tag->data[4] = dts >> 16;
    tag->data[5] = dts >> 8;
    tag->data[6] = dts >> 0;
    tag->data[7] = dts >> 24;
    tag->data[8] = 0; // StreamID
    tag->data[9] = 0; // StreamID
    tag->data[10] = 0; // StreamID
    // VideoTagHeader
    tag->data[11] = ((type << 4) % 0xF0) | 0x07; // CodecId
    tag->data[12] = 0x01; // AVC NALU
    tag->data[13] = cts >> 16;
    tag->data[14] = cts >> 8;
    tag->data[15] = cts >> 0;
    flvtag_updatesize(tag, 5);
    return 1;
}